

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JumpConditionalStatement.cpp
# Opt level: O0

void __thiscall
IRT::JumpConditionalStatement::JumpConditionalStatement
          (JumpConditionalStatement *this,LogicOperatorType type,Expression *left,Expression *right,
          Label *label_true,Label *label_false)

{
  Label *label_false_local;
  Label *label_true_local;
  Expression *right_local;
  Expression *left_local;
  LogicOperatorType type_local;
  JumpConditionalStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_BaseElement._vptr_BaseElement =
       (_func_int **)&PTR__JumpConditionalStatement_001d9cf8;
  this->operator_type_ = type;
  Label::Label(&this->label_true_,label_true);
  Label::Label(&this->label_false_,label_false);
  this->left_operand_ = left;
  this->right_operand_ = right;
  return;
}

Assistant:

JumpConditionalStatement::JumpConditionalStatement(LogicOperatorType type,
                                                   Expression *left,
                                                   Expression *right,
                                                   Label label_true,
                                                   Label label_false)
    : operator_type_(type),
      left_operand_(left),
      right_operand_(right),
      label_true_(label_true),
      label_false_(label_false) {}